

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall
PString::SetDefaultValue
          (PString *this,void *base,uint offset,
          TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
          *special)

{
  pair<const_PType_*,_unsigned_int> local_10;
  
  if (base != (void *)0x0) {
    *(undefined8 *)((long)base + (ulong)offset) = 0x71deec;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
  }
  if (special !=
      (TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_> *)0x0
     ) {
    local_10.first = (PType *)this;
    local_10.second = offset;
    TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>::Push
              (special,&local_10);
  }
  return;
}

Assistant:

void PString::SetDefaultValue(void *base, unsigned offset, TArray<FTypeAndOffset> *special) const
{
	if (base != nullptr) new((BYTE *)base + offset) FString;
	if (special != NULL)
	{
		special->Push(std::make_pair(this, offset));
	}
}